

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Vfs_getmypid(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  code *pcVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  
  pvVar1 = pCtx->pFunc->pUserData;
  if ((pvVar1 == (void *)0x0) || (pcVar2 = *(code **)((long)pvVar1 + 0x130), pcVar2 == (code *)0x0))
  {
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",
               (pCtx->pFunc->sName).zString);
    jx9_result_int(pCtx,-1);
  }
  else {
    uVar3 = (*pcVar2)(pCtx,CONCAT44(in_register_00000034,nArg));
    jx9_result_int64(pCtx,(ulong)uVar3);
  }
  return 0;
}

Assistant:

static int jx9Vfs_getmypid(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nProcessId;
	jx9_vfs *pVfs;
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xProcessId == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* IO routine not implemented, return -1 */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nProcessId = (jx9_int64)pVfs->xProcessId();
	/* Set the result */
	jx9_result_int64(pCtx, nProcessId);
	return JX9_OK;
}